

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::ReferenceRenderer::draw
          (ReferenceRenderer *this,RenderState *renderState,PrimitiveType primitive,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          *vertexBuffer)

{
  ulong uVar1;
  pointer pVVar2;
  long lVar3;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> positions;
  PrimitiveList primitives;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_128;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_108;
  RenderState *local_e8;
  ReferenceRenderer *local_e0;
  PrimitiveList local_d8;
  DrawCommand local_b8;
  VertexAttrib local_88;
  undefined8 uStack_60;
  undefined8 local_58;
  pointer pVStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  rr::PrimitiveList::PrimitiveList
            (&local_d8,primitive,
             (int)((ulong)((long)(vertexBuffer->
                                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(vertexBuffer->
                                super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 5),0);
  local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar2 = (vertexBuffer->
           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((vertexBuffer->
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    lVar3 = 0;
    uVar1 = 0;
    local_e8 = renderState;
    local_e0 = this;
    do {
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&local_108,(value_type *)((long)(pVVar2->position).m_data + lVar3));
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&local_128,(value_type *)((long)(pVVar2->color).m_data + lVar3));
      uVar1 = uVar1 + 1;
      pVVar2 = (vertexBuffer->
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
      renderState = local_e8;
      this = local_e0;
    } while (uVar1 < (ulong)((long)(vertexBuffer->
                                   super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 5))
    ;
  }
  local_b8.primitives = &local_d8;
  local_b8.vertexAttribs = &local_88;
  local_88.stride = 0;
  local_88.instanceDivisor = 0;
  local_88.generic.v._0_8_ = 0;
  local_88.generic.v._8_8_ = 0;
  local_58 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_88.type = VERTEXATTRIBTYPE_FLOAT;
  local_88.size = 4;
  uStack_60 = 0x400000000;
  local_b8.renderTarget = this->m_renderTarget;
  local_b8.program = this->m_program;
  local_b8.numVertexAttribs = 2;
  local_b8.state = renderState;
  local_88.pointer =
       local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pVStack_50 = local_128.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
  rr::Renderer::draw(&this->m_renderer,&local_b8);
  if (local_128.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ReferenceRenderer::draw (const rr::RenderState&			renderState,
							  const rr::PrimitiveType			primitive,
							  const std::vector<Vertex4RGBA>&	vertexBuffer)
{
	const rr::PrimitiveList primitives(primitive, (int)vertexBuffer.size(), 0);

	std::vector<tcu::Vec4> positions;
	std::vector<tcu::Vec4> colors;

	for (size_t vertexNdx = 0; vertexNdx < vertexBuffer.size(); vertexNdx++)
	{
		const Vertex4RGBA& v = vertexBuffer[vertexNdx];
		positions.push_back(v.position);
		colors.push_back(v.color);
	}

	rr::VertexAttrib vertexAttribs[2];

	// Position attribute
	vertexAttribs[0].type		= rr::VERTEXATTRIBTYPE_FLOAT;
	vertexAttribs[0].size		= 4;
	vertexAttribs[0].pointer	= positions.data();
	// UV attribute
	vertexAttribs[1].type		= rr::VERTEXATTRIBTYPE_FLOAT;
	vertexAttribs[1].size		= 4;
	vertexAttribs[1].pointer	= colors.data();

	rr::DrawCommand drawQuadCommand(renderState, *m_renderTarget, *m_program, 2, vertexAttribs, primitives);

	m_renderer.draw(drawQuadCommand);
}